

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error T1_Get_Multi_Master(T1_Face face,FT_Multi_Master *master)

{
  PS_Blend pPVar1;
  FT_MM_Axis *pFVar2;
  PS_DesignMapRec *pPVar3;
  PS_DesignMap map;
  FT_MM_Axis *axis;
  FT_Error error;
  FT_UInt n;
  PS_Blend blend;
  FT_Multi_Master *master_local;
  T1_Face face_local;
  
  pPVar1 = face->blend;
  axis._0_4_ = 6;
  if (pPVar1 != (PS_Blend)0x0) {
    master->num_axis = pPVar1->num_axis;
    master->num_designs = pPVar1->num_designs;
    for (axis._4_4_ = 0; axis._4_4_ < pPVar1->num_axis; axis._4_4_ = axis._4_4_ + 1) {
      pFVar2 = master->axis + axis._4_4_;
      pPVar3 = pPVar1->design_map + axis._4_4_;
      pFVar2->name = pPVar1->axis_names[axis._4_4_];
      pFVar2->minimum = *pPVar3->design_points;
      pFVar2->maximum = pPVar3->design_points[(int)(pPVar3->num_points - 1)];
    }
    axis._0_4_ = 0;
  }
  return (FT_Error)axis;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Get_Multi_Master( T1_Face           face,
                       FT_Multi_Master*  master )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   n;
    FT_Error  error;


    error = FT_THROW( Invalid_Argument );

    if ( blend )
    {
      master->num_axis    = blend->num_axis;
      master->num_designs = blend->num_designs;

      for ( n = 0; n < blend->num_axis; n++ )
      {
        FT_MM_Axis*   axis = master->axis + n;
        PS_DesignMap  map = blend->design_map + n;


        axis->name    = blend->axis_names[n];
        axis->minimum = map->design_points[0];
        axis->maximum = map->design_points[map->num_points - 1];
      }

      error = FT_Err_Ok;
    }

    return error;
  }